

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tctok.cpp
# Opt level: O0

void __thiscall CTcTokenizer::stuff_text(CTcTokenizer *this,char *txt,size_t len,int expand)

{
  CTcTokString *str;
  CTcTokString *this_00;
  int in_ECX;
  CTcTokenizer *in_RDX;
  char *in_RSI;
  long in_RDI;
  int p_ofs;
  CTcTokString expbuf;
  CTcTokenizer *in_stack_ffffffffffffff90;
  char *in_stack_ffffffffffffffc8;
  char *in_stack_ffffffffffffffd0;
  CTcTokString *in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffe0;
  CTcTokenizer *local_18;
  char *local_10;
  
  CTcTokString::CTcTokString((CTcTokString *)&stack0xffffffffffffffc0);
  local_18 = in_RDX;
  local_10 = in_RSI;
  if (in_ECX != 0) {
    expand_macros((CTcTokenizer *)CONCAT44(in_ECX,in_stack_ffffffffffffffe0),
                  in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0,
                  (size_t)in_stack_ffffffffffffffc8);
    local_10 = CTcTokString::get_text((CTcTokString *)&stack0xffffffffffffffc0);
    in_stack_ffffffffffffff90 =
         (CTcTokenizer *)CTcTokString::get_text_len((CTcTokString *)&stack0xffffffffffffffc0);
    local_18 = in_stack_ffffffffffffff90;
  }
  str = (CTcTokString *)utf8_ptr::getptr((utf8_ptr *)(in_RDI + 0x90));
  this_00 = (CTcTokString *)CTcTokString::get_text(*(CTcTokString **)(in_RDI + 0x98));
  (**(code **)(**(long **)(in_RDI + 0x98) + 0x38))
            (*(long **)(in_RDI + 0x98),(int)str - (int)this_00,local_10,local_18);
  start_new_line(in_stack_ffffffffffffff90,str,(int)((ulong)this_00 >> 0x20));
  CTcTokString::~CTcTokString(this_00);
  return;
}

Assistant:

void CTcTokenizer::stuff_text(const char *txt, size_t len, int expand)
{
    CTcTokString expbuf;
    int p_ofs;
    
    /* if desired, expand macros */
    if (expand)
    {
        /* expand macros in the text, storing the result in 'expbuf' */
        expand_macros(&expbuf, txt, len);

        /* use the expanded version as the stuffed text now */
        txt = expbuf.get_text();
        len = expbuf.get_text_len();
    }

    /* get the current p_ offset */
    p_ofs = p_.getptr() - curbuf_->get_text();

    /* insert the text into the buffer */
    curbuf_->insert(p_ofs, txt, len);

    /* reset p_ in case the curbuf_ buffer was reallocated for expansion */
    start_new_line(curbuf_, p_ofs);
}